

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadEffect(ColladaParser *this,Effect *pEffect)

{
  char cVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string local_40;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  cVar1 = (char)iVar2;
  do {
    if (cVar1 == '\0') {
      return;
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    if (iVar2 == 1) {
      if (iVar3 != 1) {
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"profile_COMMON");
      if (iVar2 == 0) {
        ReadEffectProfileCommon(this,pEffect);
      }
      else {
        SkipElement(this);
      }
    }
    else if (iVar3 == 2) {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
      iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"effect");
      if (iVar2 == 0) {
        return;
      }
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Expected end of <effect> element.","");
      ThrowException(this,&local_40);
    }
    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    cVar1 = (char)iVar2;
  } while( true );
}

Assistant:

void ColladaParser::ReadEffect(Collada::Effect& pEffect)
{
    // for the moment we don't support any other type of effect.
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("profile_COMMON"))
                ReadEffectProfileCommon(pEffect);
            else
                SkipElement();
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "effect") != 0)
                ThrowException("Expected end of <effect> element.");

            break;
        }
    }
}